

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

int enc_row_mt_worker_hook(void *arg1,void *unused)

{
  aom_internal_error_info *paVar1;
  TileDataEnc *pTVar2;
  BLOCK_SIZE BVar3;
  uint8_t uVar4;
  byte bVar5;
  uint uVar6;
  uint uVar7;
  AV1_COMP *cpi;
  TileDataEnc *pTVar8;
  ThreadData_conflict *td;
  FRAME_CONTEXT *__dest;
  MB_RD_RECORD *pMVar9;
  int *piVar10;
  uint uVar11;
  void *pvVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  PC_TREE *pPVar16;
  byte bVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  long lVar21;
  AV1LfSync *pAVar22;
  int iVar23;
  int iVar24;
  pthread_mutex_t *ppVar25;
  AV1LfMTInfo *pAVar26;
  TileInfo *tile;
  bool bVar27;
  _Bool do_pipelined_lpf_mt_with_enc;
  AV1_COMMON *cm;
  int current_mi_row;
  int end_of_frame;
  int cur_tile_id;
  void *local_b8;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  uint local_9c;
  AV1_COMMON *cm_1;
  undefined8 *local_90;
  ulong local_88;
  long local_80;
  AV1LfMTInfo *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  long local_58;
  AV1LfSync *local_50;
  AV1LfSync *local_48;
  pthread_mutex_t *local_40;
  aom_internal_error_info *local_38;
  
  cpi = *arg1;
  lVar21 = *(long *)((long)arg1 + 8);
  iVar19 = *(int *)((long)arg1 + 0x1cc);
  ppVar25 = (cpi->mt_info).enc_row_mt.mutex_;
  paVar1 = (aom_internal_error_info *)((long)arg1 + 0x18);
  local_48 = *(AV1LfSync **)((long)arg1 + 0x1b8);
  *(aom_internal_error_info **)(lVar21 + 0x2b90) = paVar1;
  if ((cpi->mt_info).pipeline_lpf_mt_with_enc == 0) {
    bVar27 = false;
  }
  else {
    bVar27 = true;
    if ((cpi->common).lf.filter_level[0] == 0) {
      bVar27 = (cpi->common).lf.filter_level[1] != 0;
    }
  }
  cm_1 = &cpi->common;
  iVar13 = _setjmp((__jmp_buf_tag *)((long)arg1 + 0xf0));
  if (iVar13 == 0) {
    *(undefined4 *)((long)arg1 + 0xe8) = 1;
    iVar13 = ((cpi->common).seq_params)->mib_size_log2;
    iVar23 = (cpi->mt_info).enc_row_mt.thread_id_to_tile_id[iVar19];
    cur_tile_id = iVar23;
    local_38 = paVar1;
    if ((cpi->sf).rt_sf.use_nonrd_pick_mode == 0) {
      lVar18 = *(long *)((long)arg1 + 8);
      *(undefined8 *)(lVar18 + 0x26e50) = 0;
    }
    else {
      pPVar16 = av1_alloc_pc_tree_node(((cpi->common).seq_params)->sb_size);
      lVar18 = *(long *)((long)arg1 + 8);
      *(PC_TREE **)(lVar18 + 0x26e50) = pPVar16;
      if (pPVar16 == (PC_TREE *)0x0) {
        aom_internal_error(*(aom_internal_error_info **)(lVar21 + 0x2b90),AOM_CODEC_MEM_ERROR,
                           "Failed to allocate PC_TREE");
        lVar18 = *(long *)((long)arg1 + 8);
      }
    }
    BVar3 = cpi->fp_block_size;
    end_of_frame = 0;
    *(FRAME_CONTEXT **)(lVar18 + 0x2b38) = (cpi->common).fc;
    local_9c = (uint)BVar3;
    local_b8 = arg1;
    local_40 = ppVar25;
    while( true ) {
      pvVar12 = local_b8;
      current_mi_row = -1;
      pthread_mutex_lock((pthread_mutex_t *)ppVar25);
      iVar19 = 1;
      if ((cpi->mt_info).enc_row_mt.row_mt_exit != false) break;
      iVar19 = get_next_job(cpi->tile_data + iVar23,&current_mi_row,
                            ((cpi->common).seq_params)->mib_size);
      bVar17 = (byte)iVar13;
      if (iVar19 == 0) {
        switch_tile_and_get_next_job
                  (&cpi->common,cpi->tile_data,&cur_tile_id,&current_mi_row,&end_of_frame,0,
                   (BLOCK_SIZE)local_9c);
        iVar19 = end_of_frame;
        pthread_mutex_unlock((pthread_mutex_t *)ppVar25);
        if (iVar19 != 0) {
          if (!bVar27) goto LAB_001ae1bb;
          pAVar22 = *(AV1LfSync **)((long)local_b8 + 0x1b8);
          bVar5 = (byte)((cpi->common).seq_params)->mib_size_log2;
          ppVar25 = (cpi->mt_info).enc_row_mt.mutex_;
          local_a0 = ((cpi->common).mi_params.mi_rows + (1 << (bVar5 & 0x1f)) + -1 >> (bVar5 & 0x1f)
                     ) + -1;
          local_50 = pAVar22;
          goto LAB_001ae076;
        }
      }
      else {
        pthread_mutex_unlock((pthread_mutex_t *)ppVar25);
      }
      iVar20 = cur_tile_id;
      iVar23 = current_mi_row;
      pTVar8 = cpi->tile_data;
      lVar21 = (long)cur_tile_id;
      iVar19 = pTVar8[lVar21].tile_info.tile_row;
      iVar24 = current_mi_row >> (bVar17 & 0x1f);
      local_a4 = pTVar8[lVar21].tile_info.tile_col;
      td = *(ThreadData_conflict **)((long)pvVar12 + 8);
      __dest = td->tctx;
      (td->mb).e_mbd.tile_ctx = __dest;
      (td->mb).tile_pb_ctx = &pTVar8[lVar21].tctx;
      td->abs_sum_level = 0;
      pTVar2 = pTVar8 + lVar21;
      if ((pTVar8[lVar21].allow_update_cdf == '\0') ||
         ((td->mb).row_ctx = pTVar2->row_ctx, current_mi_row == (pTVar2->tile_info).mi_row_start)) {
        memcpy(__dest,&pTVar8[lVar21].tctx,0x52fc);
      }
      local_a8 = iVar20;
      uVar4 = ((cpi->common).seq_params)->monochrome;
      for (lVar21 = 0; (ulong)(uVar4 == '\0') * 2 + 1 != lVar21; lVar21 = lVar21 + 1) {
        (td->mb).e_mbd.above_entropy_context[lVar21] =
             (cpi->common).above_contexts.entropy[lVar21][iVar19];
      }
      (td->mb).e_mbd.above_partition_context = (cpi->common).above_contexts.partition[iVar19];
      (td->mb).e_mbd.above_txfm_context = (cpi->common).above_contexts.txfm[iVar19];
      cfl_init(&(td->mb).e_mbd.cfl,(cpi->common).seq_params);
      pMVar9 = (td->mb).txfm_search_info.mb_rd_record;
      if (pMVar9 != (MB_RD_RECORD *)0x0) {
        av1_crc32c_calculator_init(&pMVar9->crc_calculator);
      }
      av1_encode_sb_row(cpi,td,iVar19,local_a4,iVar23);
      ppVar25 = local_40;
      pthread_mutex_lock((pthread_mutex_t *)local_40);
      pTVar2->abs_sum_level = pTVar2->abs_sum_level + td->abs_sum_level;
      piVar10 = &(pTVar2->row_mt_sync).num_threads_working;
      *piVar10 = *piVar10 + -1;
      piVar10 = (cpi->mt_info).enc_row_mt.num_tile_cols_done + iVar24;
      *piVar10 = *piVar10 + 1;
      pthread_cond_broadcast((pthread_cond_t *)(cpi->mt_info).enc_row_mt.cond_);
      pthread_mutex_unlock((pthread_mutex_t *)ppVar25);
      iVar23 = local_a8;
    }
    pthread_mutex_unlock((pthread_mutex_t *)ppVar25);
    *(undefined4 *)((long)pvVar12 + 0xe8) = 0;
  }
  else {
    *(undefined4 *)((long)arg1 + 0xe8) = 0;
    pthread_mutex_lock((pthread_mutex_t *)ppVar25);
    (cpi->mt_info).enc_row_mt.row_mt_exit = true;
    pthread_cond_broadcast((pthread_cond_t *)(cpi->mt_info).enc_row_mt.cond_);
    pthread_mutex_unlock((pthread_mutex_t *)ppVar25);
    uVar6 = (cpi->common).tiles.cols;
    local_58 = (long)(int)uVar6;
    uVar7 = (cpi->common).tiles.rows;
    local_ac = ((cpi->common).seq_params)->mib_size;
    uVar11 = 0;
    if (0 < (int)uVar6) {
      uVar11 = uVar6;
    }
    local_68 = (ulong)uVar11;
    local_60 = (ulong)uVar7;
    if ((int)uVar7 < 1) {
      local_60 = 0;
    }
    uVar15 = 0;
    while (pAVar22 = local_48, uVar15 != local_60) {
      local_80 = uVar15 * local_58 * 0x5d10;
      uVar14 = 0;
      local_70 = uVar15;
      while (uVar14 != local_68) {
        piVar10 = (int *)((long)(cpi->tile_data[uVar14].tctx.txb_skip_cdf + -1) + 0x2e + local_80);
        tile = (TileInfo *)((long)(cpi->tile_data[uVar14].tctx.txb_skip_cdf + -1) + 0x2e + local_80)
        ;
        local_88 = uVar14;
        iVar13 = av1_get_sb_cols_in_tile(cm_1,tile);
        iVar23 = 0;
        for (iVar19 = *piVar10; iVar19 < tile->mi_row_end; iVar19 = iVar19 + local_ac) {
          (*(cpi->mt_info).enc_row_mt.sync_write_ptr)
                    ((AV1EncRowMultiThreadSync *)(piVar10 + 0x1736),iVar23,iVar13 + -1,iVar13);
          iVar23 = iVar23 + 1;
        }
        uVar14 = local_88 + 1;
      }
      uVar15 = local_70 + 1;
    }
    if (bVar27) {
      pthread_mutex_lock((pthread_mutex_t *)local_48->job_mutex);
      pAVar22->lf_mt_exit = true;
      pthread_mutex_unlock((pthread_mutex_t *)pAVar22->job_mutex);
      av1_set_vert_loop_filter_done(cm_1,pAVar22,((cpi->common).seq_params)->mib_size_log2);
    }
    iVar19 = 0;
  }
  return iVar19;
LAB_001ae076:
  iVar19 = local_a0;
  pthread_mutex_lock((pthread_mutex_t *)pAVar22->job_mutex);
  if (pAVar22->lf_mt_exit == false) {
    iVar23 = pAVar22->jobs_dequeued;
    if (pAVar22->jobs_enqueued <= iVar23) goto LAB_001ae0a2;
    pAVar26 = pAVar22->job_queue + iVar23;
    pAVar22->jobs_dequeued = iVar23 + 1;
  }
  else {
LAB_001ae0a2:
    pAVar26 = (AV1LfMTInfo *)0x0;
  }
  pthread_mutex_unlock((pthread_mutex_t *)pAVar22->job_mutex);
  if (pAVar26 == (AV1LfMTInfo *)0x0) {
LAB_001ae1bb:
    pvVar12 = local_b8;
    av1_free_pc_tree_recursive
              (*(PC_TREE **)(*(long *)((long)local_b8 + 8) + 0x26e50),
               (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1,0,0,
               (cpi->sf).part_sf.partition_search_type);
    *(undefined8 *)(*(long *)((long)pvVar12 + 8) + 0x26e50) = 0;
    *(undefined4 *)((long)pvVar12 + 0xe8) = 0;
    return 1;
  }
  iVar20 = pAVar26->mi_row >> (bVar17 & 0x1f);
  local_90 = *(undefined8 **)((long)local_b8 + 0x1c0);
  local_b0 = pAVar26->lpf_opt_level;
  iVar23 = iVar20 + 1;
  if (iVar19 < iVar23) {
    iVar23 = iVar19;
  }
  local_78 = pAVar26;
  pthread_mutex_lock((pthread_mutex_t *)ppVar25);
  while( true ) {
    if ((cpi->mt_info).enc_row_mt.row_mt_exit != false) {
      pthread_mutex_unlock((pthread_mutex_t *)ppVar25);
      goto LAB_001ae1bb;
    }
    piVar10 = (cpi->mt_info).enc_row_mt.num_tile_cols_done;
    iVar19 = (cpi->common).tiles.cols;
    if ((iVar19 <= piVar10[iVar20]) && (iVar19 <= piVar10[iVar23])) break;
    pthread_cond_wait((pthread_cond_t *)(cpi->mt_info).enc_row_mt.cond_,(pthread_mutex_t *)ppVar25);
  }
  pthread_mutex_unlock((pthread_mutex_t *)ppVar25);
  pAVar22 = local_50;
  av1_thread_loop_filter_rows
            ((YV12_BUFFER_CONFIG *)*local_90,(AV1_COMMON *)local_90[1],
             (macroblockd_plane *)(local_90 + 2),(MACROBLOCKD *)local_90[0x3d4],local_78->mi_row,
             local_78->plane,local_78->dir,local_b0,local_50,local_38,
             (AV1_DEBLOCKING_PARAMETERS *)(local_90 + 0x3d5),(TX_SIZE *)(local_90 + 0x415),iVar13);
  goto LAB_001ae076;
}

Assistant:

static int enc_row_mt_worker_hook(void *arg1, void *unused) {
  EncWorkerData *const thread_data = (EncWorkerData *)arg1;
  AV1_COMP *const cpi = thread_data->cpi;
  int thread_id = thread_data->thread_id;
  AV1EncRowMultiThreadInfo *const enc_row_mt = &cpi->mt_info.enc_row_mt;
#if CONFIG_MULTITHREAD
  pthread_mutex_t *enc_row_mt_mutex_ = enc_row_mt->mutex_;
#endif
  (void)unused;

  struct aom_internal_error_info *const error_info = &thread_data->error_info;
  AV1LfSync *const lf_sync = thread_data->lf_sync;
  MACROBLOCKD *const xd = &thread_data->td->mb.e_mbd;
  xd->error_info = error_info;
  AV1_COMMON *volatile const cm = &cpi->common;
  volatile const bool do_pipelined_lpf_mt_with_enc = lpf_mt_with_enc_enabled(
      cpi->mt_info.pipeline_lpf_mt_with_enc, cm->lf.filter_level);

  // The jmp_buf is valid only for the duration of the function that calls
  // setjmp(). Therefore, this function must reset the 'setjmp' field to 0
  // before it returns.
  if (setjmp(error_info->jmp)) {
    error_info->setjmp = 0;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
    enc_row_mt->row_mt_exit = true;
    // Wake up all the workers waiting in launch_loop_filter_rows() to exit in
    // case of an error.
    pthread_cond_broadcast(enc_row_mt->cond_);
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    set_encoding_done(cpi);

    if (do_pipelined_lpf_mt_with_enc) {
#if CONFIG_MULTITHREAD
      pthread_mutex_lock(lf_sync->job_mutex);
      lf_sync->lf_mt_exit = true;
      pthread_mutex_unlock(lf_sync->job_mutex);
#endif
      av1_set_vert_loop_filter_done(&cpi->common, lf_sync,
                                    cpi->common.seq_params->mib_size_log2);
    }
    return 0;
  }
  error_info->setjmp = 1;

  const int mib_size_log2 = cm->seq_params->mib_size_log2;
  int cur_tile_id = enc_row_mt->thread_id_to_tile_id[thread_id];

  // Preallocate the pc_tree for realtime coding to reduce the cost of memory
  // allocation.
  if (cpi->sf.rt_sf.use_nonrd_pick_mode) {
    thread_data->td->pc_root = av1_alloc_pc_tree_node(cm->seq_params->sb_size);
    if (!thread_data->td->pc_root)
      aom_internal_error(xd->error_info, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PC_TREE");
  } else {
    thread_data->td->pc_root = NULL;
  }

  assert(cur_tile_id != -1);

  const BLOCK_SIZE fp_block_size = cpi->fp_block_size;
  int end_of_frame = 0;
  bool row_mt_exit = false;

  // When master thread does not have a valid job to process, xd->tile_ctx
  // is not set and it contains NULL pointer. This can result in NULL pointer
  // access violation if accessed beyond the encode stage. Hence, updating
  // thread_data->td->mb.e_mbd.tile_ctx is initialized with common frame
  // context to avoid NULL pointer access in subsequent stages.
  thread_data->td->mb.e_mbd.tile_ctx = cm->fc;
  while (1) {
    int current_mi_row = -1;
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    row_mt_exit = enc_row_mt->row_mt_exit;
    // row_mt_exit check here can be avoided as it is checked after
    // sync_read_ptr() in encode_sb_row(). However, checking row_mt_exit here,
    // tries to return before calling the function get_next_job().
    if (!row_mt_exit &&
        !get_next_job(&cpi->tile_data[cur_tile_id], &current_mi_row,
                      cm->seq_params->mib_size)) {
      // No jobs are available for the current tile. Query for the status of
      // other tiles and get the next job if available
      switch_tile_and_get_next_job(cm, cpi->tile_data, &cur_tile_id,
                                   &current_mi_row, &end_of_frame, 0,
                                   fp_block_size);
    }
#if CONFIG_MULTITHREAD
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
    // When row_mt_exit is set to true, other workers need not pursue any
    // further jobs.
    if (row_mt_exit) {
      error_info->setjmp = 0;
      return 1;
    }

    if (end_of_frame) break;

    TileDataEnc *const this_tile = &cpi->tile_data[cur_tile_id];
    AV1EncRowMultiThreadSync *const row_mt_sync = &this_tile->row_mt_sync;
    const TileInfo *const tile_info = &this_tile->tile_info;
    const int tile_row = tile_info->tile_row;
    const int tile_col = tile_info->tile_col;
    ThreadData *td = thread_data->td;
    const int sb_row = current_mi_row >> mib_size_log2;

    assert(current_mi_row != -1 && current_mi_row <= tile_info->mi_row_end);

    td->mb.e_mbd.tile_ctx = td->tctx;
    td->mb.tile_pb_ctx = &this_tile->tctx;
    td->abs_sum_level = 0;

    if (this_tile->allow_update_cdf) {
      td->mb.row_ctx = this_tile->row_ctx;
      if (current_mi_row == tile_info->mi_row_start)
        memcpy(td->mb.e_mbd.tile_ctx, &this_tile->tctx, sizeof(FRAME_CONTEXT));
    } else {
      memcpy(td->mb.e_mbd.tile_ctx, &this_tile->tctx, sizeof(FRAME_CONTEXT));
    }

    av1_init_above_context(&cm->above_contexts, av1_num_planes(cm), tile_row,
                           &td->mb.e_mbd);
#if !CONFIG_REALTIME_ONLY
    cfl_init(&td->mb.e_mbd.cfl, cm->seq_params);
#endif
    if (td->mb.txfm_search_info.mb_rd_record != NULL) {
      av1_crc32c_calculator_init(
          &td->mb.txfm_search_info.mb_rd_record->crc_calculator);
    }

    av1_encode_sb_row(cpi, td, tile_row, tile_col, current_mi_row);
#if CONFIG_MULTITHREAD
    pthread_mutex_lock(enc_row_mt_mutex_);
#endif
    this_tile->abs_sum_level += td->abs_sum_level;
    row_mt_sync->num_threads_working--;
    enc_row_mt->num_tile_cols_done[sb_row]++;
#if CONFIG_MULTITHREAD
    pthread_cond_broadcast(enc_row_mt->cond_);
    pthread_mutex_unlock(enc_row_mt_mutex_);
#endif
  }
  if (do_pipelined_lpf_mt_with_enc) {
    // Loop-filter a superblock row if encoding of the current and next
    // superblock row is complete.
    // TODO(deepa.kg @ittiam.com) Evaluate encoder speed by interleaving
    // encoding and loop filter stage.
    launch_loop_filter_rows(cm, thread_data, enc_row_mt, mib_size_log2);
  }
  av1_free_pc_tree_recursive(thread_data->td->pc_root, av1_num_planes(cm), 0, 0,
                             cpi->sf.part_sf.partition_search_type);
  thread_data->td->pc_root = NULL;
  error_info->setjmp = 0;
  return 1;
}